

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O3

bool __thiscall
Lib::
FilteredIterator<Lib::VirtualIterator<Kernel::TypedTermList>,_Kernel::EqHelper::IsNonVariable,_false>
::hasNext(FilteredIterator<Lib::VirtualIterator<Kernel::TypedTermList>,_Kernel::EqHelper::IsNonVariable,_false>
          *this)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  uint64_t extraout_RDX;
  
  if ((this->_next).super_OptionBase<Kernel::TypedTermList>._isSome == false) {
    do {
      iVar1 = (*((this->_inn)._core)->_vptr_IteratorCore[2])();
      if ((char)iVar1 == '\0') {
        return false;
      }
      uVar2 = (*((this->_inn)._core)->_vptr_IteratorCore[3])();
    } while ((uVar2 & 3) != 0);
    (this->_next).super_OptionBase<Kernel::TypedTermList>._elem._elem.init.super_TermList._content =
         CONCAT44(extraout_var,uVar2);
    (this->_next).super_OptionBase<Kernel::TypedTermList>._elem._elem.init._sort._content =
         extraout_RDX;
    (this->_next).super_OptionBase<Kernel::TypedTermList>._isSome = true;
  }
  return true;
}

Assistant:

bool hasNext()
  {
    if(_next.isSome()) {
      return true;
    }
    while(_inn.hasNext()) {
      OWN_ELEMENT_TYPE next = move_if_value<OWN_ELEMENT_TYPE>(_inn.next());
      if(_func(next)) {
        _next = Option<OWN_ELEMENT_TYPE>(move_if_value<OWN_ELEMENT_TYPE>(next));
        return true;
      } else {
        __doDeletion<deleteFilteredOut>{}(_inn);
      }
    }
    return false;
  }